

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlyParser.cpp
# Opt level: O1

bool __thiscall
Assimp::PLY::DOM::ParseElementInstanceListsBinary
          (DOM *this,IOStreamBuffer<char> *streamBuffer,vector<char,_std::allocator<char>_> *buffer,
          char **pCur,uint *bufferSize,PLYImporter *loader,bool p_bBE)

{
  Logger *pLVar1;
  Element *pcElement;
  pointer this_00;
  ulong uVar2;
  long lVar3;
  
  pLVar1 = DefaultLogger::get();
  Logger::debug(pLVar1,"PLY::DOM::ParseElementInstanceListsBinary() begin");
  std::vector<Assimp::PLY::ElementInstanceList,_std::allocator<Assimp::PLY::ElementInstanceList>_>::
  resize(&this->alElementData,
         ((long)(this->alElements).
                super__Vector_base<Assimp::PLY::Element,_std::allocator<Assimp::PLY::Element>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(this->alElements).
                super__Vector_base<Assimp::PLY::Element,_std::allocator<Assimp::PLY::Element>_>.
                _M_impl.super__Vector_impl_data._M_start >> 3) * -0x71c71c71c71c71c7);
  pcElement = (this->alElements).
              super__Vector_base<Assimp::PLY::Element,_std::allocator<Assimp::PLY::Element>_>.
              _M_impl.super__Vector_impl_data._M_start;
  if (pcElement !=
      (this->alElements).
      super__Vector_base<Assimp::PLY::Element,_std::allocator<Assimp::PLY::Element>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    this_00 = (this->alElementData).
              super__Vector_base<Assimp::PLY::ElementInstanceList,_std::allocator<Assimp::PLY::ElementInstanceList>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      if (pcElement->eSemantic < EEST_Edge) {
        ElementInstanceList::ParseInstanceListBinary
                  (streamBuffer,buffer,pCur,bufferSize,pcElement,(ElementInstanceList *)0x0,loader,
                   p_bBE);
      }
      else {
        std::vector<Assimp::PLY::ElementInstance,_std::allocator<Assimp::PLY::ElementInstance>_>::
        resize(&this_00->alInstances,(ulong)pcElement->NumOccur);
        if (pcElement == (Element *)0x0) {
          __assert_fail("__null != pcElement",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Ply/PlyParser.cpp"
                        ,0x2e1,
                        "static bool Assimp::PLY::ElementInstanceList::ParseInstanceListBinary(IOStreamBuffer<char> &, std::vector<char> &, const char *&, unsigned int &, const PLY::Element *, PLY::ElementInstanceList *, PLYImporter *, bool)"
                       );
        }
        if (pcElement->NumOccur != 0) {
          lVar3 = 0;
          uVar2 = 0;
          do {
            ElementInstance::ParseInstanceBinary
                      (streamBuffer,buffer,pCur,bufferSize,pcElement,
                       (ElementInstance *)
                       ((long)&(((this_00->alInstances).
                                 super__Vector_base<Assimp::PLY::ElementInstance,_std::allocator<Assimp::PLY::ElementInstance>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->alProperties).
                               super__Vector_base<Assimp::PLY::PropertyInstance,_std::allocator<Assimp::PLY::PropertyInstance>_>
                       + lVar3),p_bBE);
            uVar2 = uVar2 + 1;
            lVar3 = lVar3 + 0x18;
          } while (uVar2 < pcElement->NumOccur);
        }
      }
      pcElement = pcElement + 1;
      this_00 = this_00 + 1;
    } while (pcElement !=
             (this->alElements).
             super__Vector_base<Assimp::PLY::Element,_std::allocator<Assimp::PLY::Element>_>._M_impl
             .super__Vector_impl_data._M_finish);
  }
  pLVar1 = DefaultLogger::get();
  Logger::debug(pLVar1,"PLY::DOM::ParseElementInstanceListsBinary() succeeded");
  return true;
}

Assistant:

bool PLY::DOM::ParseElementInstanceListsBinary(IOStreamBuffer<char> &streamBuffer, std::vector<char> &buffer,
    const char* &pCur,
    unsigned int &bufferSize,
    PLYImporter* loader,
    bool p_bBE)
{
    ASSIMP_LOG_DEBUG("PLY::DOM::ParseElementInstanceListsBinary() begin");
  alElementData.resize(alElements.size());

  std::vector<PLY::Element>::const_iterator i = alElements.begin();
  std::vector<PLY::ElementInstanceList>::iterator a = alElementData.begin();

  // parse all element instances
  for (; i != alElements.end(); ++i, ++a)
  {
    if ((*i).eSemantic == EEST_Vertex || (*i).eSemantic == EEST_Face || (*i).eSemantic == EEST_TriStrip)
    {
      PLY::ElementInstanceList::ParseInstanceListBinary(streamBuffer, buffer, pCur, bufferSize, &(*i), NULL, loader, p_bBE);
    }
    else
    {
      (*a).alInstances.resize((*i).NumOccur);
      PLY::ElementInstanceList::ParseInstanceListBinary(streamBuffer, buffer, pCur, bufferSize, &(*i), &(*a), NULL, p_bBE);
    }
  }

  ASSIMP_LOG_DEBUG("PLY::DOM::ParseElementInstanceListsBinary() succeeded");
  return true;
}